

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineVertexInputStateCreateInfo>
          (Impl *this,VkPipelineVertexInputStateCreateInfo **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineVertexInputStateCreateInfo *pVVar1;
  void *pvVar2;
  VkVertexInputBindingDescription *pVVar3;
  VkVertexInputAttributeDescription *pVVar4;
  undefined4 uVar5;
  VkPipelineVertexInputStateCreateFlags VVar6;
  uint32_t uVar7;
  VkStructureType VVar8;
  undefined4 uVar9;
  bool bVar10;
  VkPipelineVertexInputStateCreateInfo *pVVar11;
  bool bVar12;
  void *pNext;
  void *local_38;
  
  pVVar1 = *sub_info;
  bVar12 = true;
  if (pVVar1 != (VkPipelineVertexInputStateCreateInfo *)0x0) {
    pVVar11 = (VkPipelineVertexInputStateCreateInfo *)
              ScratchAllocator::allocate_raw(alloc,0x30,0x10);
    if (pVVar11 != (VkPipelineVertexInputStateCreateInfo *)0x0) {
      VVar8 = pVVar1->sType;
      uVar9 = *(undefined4 *)&pVVar1->field_0x4;
      pvVar2 = pVVar1->pNext;
      VVar6 = pVVar1->flags;
      uVar7 = pVVar1->vertexBindingDescriptionCount;
      pVVar3 = pVVar1->pVertexBindingDescriptions;
      uVar5 = *(undefined4 *)&pVVar1->field_0x24;
      pVVar4 = pVVar1->pVertexAttributeDescriptions;
      pVVar11->vertexAttributeDescriptionCount = pVVar1->vertexAttributeDescriptionCount;
      *(undefined4 *)&pVVar11->field_0x24 = uVar5;
      pVVar11->pVertexAttributeDescriptions = pVVar4;
      pVVar11->flags = VVar6;
      pVVar11->vertexBindingDescriptionCount = uVar7;
      pVVar11->pVertexBindingDescriptions = pVVar3;
      pVVar11->sType = VVar8;
      *(undefined4 *)&pVVar11->field_0x4 = uVar9;
      pVVar11->pNext = pvVar2;
    }
    *sub_info = pVVar11;
    local_38 = (void *)0x0;
    bVar10 = copy_pnext_chain(this,pVVar11->pNext,alloc,&local_38,dynamic_state_info,state_flags);
    if (bVar10) {
      (*sub_info)->pNext = local_38;
    }
    else {
      bVar12 = false;
    }
  }
  return bVar12;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}